

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.c
# Opt level: O0

strbuilder * strbuilder_append_structured_data(strbuilder *builder,stumpless_entry *entry)

{
  stumpless_element *buffer;
  stumpless_param *buffer_00;
  strbuilder *psVar1;
  stumpless_param *param;
  stumpless_element *element;
  size_t j;
  size_t i;
  stumpless_entry *entry_local;
  strbuilder *builder_local;
  
  if (entry->element_count == 0) {
    builder_local = strbuilder_append_char(builder,'-');
  }
  else {
    entry_local = (stumpless_entry *)builder;
    for (j = 0; j < entry->element_count; j = j + 1) {
      buffer = entry->elements[j];
      psVar1 = strbuilder_append_char((strbuilder *)entry_local,'[');
      entry_local = (stumpless_entry *)
                    strbuilder_append_buffer(psVar1,buffer->name,buffer->name_length);
      for (element = (stumpless_element *)0x0;
          element < (stumpless_element *)entry->elements[j]->param_count;
          element = (stumpless_element *)(element->name + 1)) {
        buffer_00 = buffer->params[(long)element];
        psVar1 = strbuilder_append_char((strbuilder *)entry_local,' ');
        psVar1 = strbuilder_append_buffer(psVar1,buffer_00->name,buffer_00->name_length);
        psVar1 = strbuilder_append_char(psVar1,'=');
        psVar1 = strbuilder_append_char(psVar1,'\"');
        psVar1 = strbuilder_append_buffer(psVar1,buffer_00->value,buffer_00->value_length);
        entry_local = (stumpless_entry *)strbuilder_append_char(psVar1,'\"');
      }
      entry_local = (stumpless_entry *)strbuilder_append_char((strbuilder *)entry_local,']');
    }
    builder_local = (strbuilder *)entry_local;
  }
  return builder_local;
}

Assistant:

struct strbuilder *
strbuilder_append_structured_data( struct strbuilder *builder,
                                   const struct stumpless_entry *entry ) {
  size_t i;
  size_t j;
  const struct stumpless_element *element;
  const struct stumpless_param *param;

  if( entry->element_count == 0 ) {
    return strbuilder_append_char( builder, '-' );
  }

  for( i = 0; i < entry->element_count; i++ ) {
    element = entry->elements[i];

    builder = strbuilder_append_char( builder, '[' );
    builder = strbuilder_append_buffer( builder,
                                        element->name, element->name_length );

    for( j = 0; j < entry->elements[i]->param_count; j++ ) {
      param = element->params[j];

      builder = strbuilder_append_char( builder, ' ' );

      builder = strbuilder_append_buffer( builder,
                                          param->name, param->name_length );

      builder = strbuilder_append_char( builder, '=' );
      builder = strbuilder_append_char( builder, '"' );

      builder = strbuilder_append_buffer( builder,
                                          param->value, param->value_length );

      builder = strbuilder_append_char( builder, '"' );
    }

    builder = strbuilder_append_char( builder, ']' );
  }

  return builder;
}